

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_s16__ieee(drwav *pWav,drwav_uint64 samplesToRead,drwav_int16 *pBufferOut)

{
  drwav_uint64 dVar1;
  drwav_uint64 dVar2;
  drwav_int16 *local_1048;
  drwav_uint64 samplesRead;
  uchar sampleData [4096];
  drwav_uint64 totalSamplesRead;
  drwav_int16 *pBufferOut_local;
  drwav_uint64 samplesToRead_local;
  drwav *pWav_local;
  
  sampleData[0xff8] = '\0';
  sampleData[0xff9] = '\0';
  sampleData[0xffa] = '\0';
  sampleData[0xffb] = '\0';
  sampleData[0xffc] = '\0';
  sampleData[0xffd] = '\0';
  sampleData[0xffe] = '\0';
  sampleData[0xfff] = '\0';
  totalSamplesRead = (drwav_uint64)pBufferOut;
  pBufferOut_local = (drwav_int16 *)samplesToRead;
  while( true ) {
    if (pBufferOut_local == (drwav_int16 *)0x0) {
      dVar2._0_1_ = sampleData[0xff8];
      dVar2._1_1_ = sampleData[0xff9];
      dVar2._2_1_ = sampleData[0xffa];
      dVar2._3_1_ = sampleData[0xffb];
      dVar2._4_1_ = sampleData[0xffc];
      dVar2._5_1_ = sampleData[0xffd];
      dVar2._6_1_ = sampleData[0xffe];
      dVar2._7_1_ = sampleData[0xfff];
      return dVar2;
    }
    if (pBufferOut_local <
        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT216(pWav->bytesPerSample),0)) {
      local_1048 = pBufferOut_local;
    }
    else {
      local_1048 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT216(pWav->bytesPerSample),0);
    }
    dVar1 = drwav_read(pWav,(drwav_uint64)local_1048,&samplesRead);
    if (dVar1 == 0) break;
    drwav__ieee_to_s16((drwav_int16 *)totalSamplesRead,(uchar *)&samplesRead,dVar1,
                       pWav->bytesPerSample);
    totalSamplesRead = dVar1 * 2 + totalSamplesRead;
    pBufferOut_local = (drwav_int16 *)((long)pBufferOut_local - dVar1);
    sampleData._4088_8_ = dVar1 + sampleData._4088_8_;
  }
  dVar1._0_1_ = sampleData[0xff8];
  dVar1._1_1_ = sampleData[0xff9];
  dVar1._2_1_ = sampleData[0xffa];
  dVar1._3_1_ = sampleData[0xffb];
  dVar1._4_1_ = sampleData[0xffc];
  dVar1._5_1_ = sampleData[0xffd];
  dVar1._6_1_ = sampleData[0xffe];
  dVar1._7_1_ = sampleData[0xfff];
  return dVar1;
}

Assistant:

drwav_uint64 drwav_read_s16__ieee(drwav* pWav, drwav_uint64 samplesToRead, drwav_int16* pBufferOut) {
    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__ieee_to_s16(pBufferOut, sampleData, (size_t)samplesRead, pWav->bytesPerSample);

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}